

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

void soplex::
     SPxShellsort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  bool bVar4;
  ulong *puVar5;
  undefined8 *puVar6;
  int in_ECX;
  undefined8 *puVar7;
  IdxCompare *in_RDX;
  int in_ESI;
  long in_RDI;
  IdxElement a;
  IdxElement b;
  IdxElement tempkey;
  int j;
  int i;
  int first;
  int h;
  int k;
  int local_30;
  int local_2c;
  int local_20;
  double dVar8;
  
  for (local_20 = 2; -1 < local_20; local_20 = local_20 + -1) {
    iVar1 = SPxShellsort<soplex::SPxPricer<double>::IdxElement,_soplex::SPxPricer<double>::IdxCompare>
            ::incs[local_20];
    for (local_2c = iVar1 + in_ECX; local_2c <= in_ESI; local_2c = local_2c + 1) {
      puVar5 = (ulong *)(in_RDI + (long)local_2c * 0x10);
      uVar2 = *puVar5;
      dVar3 = (double)puVar5[1];
      local_30 = local_2c;
      while( true ) {
        bVar4 = false;
        if (iVar1 + in_ECX <= local_30) {
          puVar5 = (ulong *)(in_RDI + (long)(local_30 - iVar1) * 0x10);
          a._0_8_ = uVar2 & 0xffffffff;
          b._0_8_ = *puVar5 & 0xffffffff;
          a.val = dVar3;
          b.val = (double)puVar5[1];
          dVar8 = SPxPricer<double>::IdxCompare::operator()(in_RDX,a,b);
          bVar4 = dVar8 < 0.0;
        }
        if (!bVar4) break;
        puVar7 = (undefined8 *)(in_RDI + (long)(local_30 - iVar1) * 0x10);
        puVar6 = (undefined8 *)(in_RDI + (long)local_30 * 0x10);
        *puVar6 = *puVar7;
        puVar6[1] = puVar7[1];
        local_30 = local_30 - iVar1;
      }
      puVar5 = (ulong *)(in_RDI + (long)local_30 * 0x10);
      *puVar5 = uVar2;
      puVar5[1] = (ulong)dVar3;
    }
  }
  return;
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}